

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O3

int base64_encode(char *in_bin,int in_len,char *out_base64,int out_len)

{
  byte bVar1;
  uint codepos;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint codepos_5;
  ulong uVar5;
  byte *pbVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  uint codepos_3;
  uint codepos_2;
  
  iVar2 = (int)out_base64;
  pcVar10 = out_base64;
  if (0 < out_len && in_len != 0) {
    pbVar6 = (byte *)(in_bin + in_len);
    pcVar8 = out_base64 + out_len;
    iVar9 = 0;
    pcVar4 = out_base64;
    do {
      bVar1 = *in_bin;
      *pcVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
      uVar5 = (ulong)((bVar1 & 3) << 4);
      if (((byte *)in_bin + 1 == pbVar6) || (pcVar8 <= pcVar4 + 1)) {
        iVar2 = (int)(pcVar4 + 1) - iVar2;
        if (out_len - iVar2 < 3) {
LAB_00115edd:
          iVar9 = 0;
          goto LAB_00115ed4;
        }
        pcVar10 = out_base64 + iVar2;
        pcVar7 = pcVar10 + 2;
        pcVar4 = out_base64 + iVar2;
        pcVar8 = pcVar4 + (uint)(out_len - iVar2);
        *pcVar10 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar5];
        pcVar10[1] = '=';
        lVar3 = 3;
LAB_00115ec3:
        pcVar10 = pcVar4 + lVar3;
        *pcVar7 = '=';
        goto LAB_00115eca;
      }
      bVar1 = ((byte *)in_bin)[1];
      pcVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [bVar1 >> 4 | uVar5];
      uVar5 = (ulong)((bVar1 & 0xf) << 2);
      if (((byte *)in_bin + 2 == pbVar6) || (pcVar10 = pcVar4 + 4, pcVar8 <= pcVar10)) {
        iVar2 = ((int)pcVar4 + 2) - iVar2;
        if (out_len - iVar2 < 2) goto LAB_00115edd;
        pcVar7 = out_base64 + iVar2 + 1;
        pcVar4 = out_base64 + iVar2;
        pcVar8 = pcVar4 + (uint)(out_len - iVar2);
        out_base64[iVar2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar5];
        lVar3 = 2;
        goto LAB_00115ec3;
      }
      bVar1 = ((byte *)in_bin)[2];
      pcVar4[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [bVar1 >> 6 | uVar5];
      pcVar4[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      iVar9 = iVar9 + 1;
      if (iVar9 == 0x12) {
        pcVar4[4] = '\n';
        pcVar10 = pcVar4 + 5;
        iVar9 = 0;
      }
      in_bin = (char *)((byte *)in_bin + 3);
    } while (((byte *)in_bin != pbVar6) && (pcVar4 = pcVar10, pcVar10 < pcVar8));
  }
  iVar2 = (int)pcVar10 - iVar2;
  pcVar10 = out_base64 + iVar2;
  pcVar8 = pcVar10 + (out_len - iVar2);
  pcVar4 = pcVar10;
LAB_00115eca:
  if (pcVar10 < pcVar8) {
    *pcVar10 = '\0';
  }
  iVar9 = (int)pcVar10 - (int)pcVar4;
LAB_00115ed4:
  return iVar2 + iVar9;
}

Assistant:

int
base64_encode(const char *in_bin, int in_len,
	      char *out_base64, int out_len)
{
	struct base64_encodestate state;
	base64_encodestate_init(&state);
	int res = base64_encode_block(in_bin, in_len, out_base64,
				      out_len, &state);
	return res + base64_encode_blockend(out_base64 + res, out_len - res,
					    &state);
}